

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileParser.cpp
# Opt level: O2

void __thiscall Assimp::Q3BSPFileParser::getTextures(Q3BSPFileParser *this)

{
  sQ3BSPTexture *__dest;
  size_t idx;
  ulong uVar1;
  Q3BSPModel *pQVar2;
  long lVar3;
  
  pQVar2 = this->m_pModel;
  if (pQVar2 != (Q3BSPModel *)0x0) {
    lVar3 = (long)(pQVar2->m_Lumps).
                  super__Vector_base<Assimp::Q3BSP::sQ3BSPLump_*,_std::allocator<Assimp::Q3BSP::sQ3BSPLump_*>_>
                  ._M_impl.super__Vector_impl_data._M_start[1]->iOffset;
    for (uVar1 = 0;
        uVar1 < (ulong)((long)(pQVar2->m_Textures).
                              super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pQVar2->m_Textures).
                              super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar1 = uVar1 + 1) {
      __dest = (sQ3BSPTexture *)operator_new(0x48);
      memcpy(__dest,(this->m_Data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start + lVar3,0x48);
      (pQVar2->m_Textures).
      super__Vector_base<Assimp::Q3BSP::sQ3BSPTexture_*,_std::allocator<Assimp::Q3BSP::sQ3BSPTexture_*>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar1] = __dest;
      lVar3 = lVar3 + 0x48;
      pQVar2 = this->m_pModel;
    }
    return;
  }
  __assert_fail("nullptr != m_pModel",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileParser.cpp"
                ,0xe9,"void Assimp::Q3BSPFileParser::getTextures()");
}

Assistant:

void Q3BSPFileParser::getTextures()
{
    ai_assert(nullptr != m_pModel );

    size_t Offset = m_pModel->m_Lumps[ kTextures ]->iOffset;
    for ( size_t idx=0; idx < m_pModel->m_Textures.size(); idx++ )
    {
        sQ3BSPTexture *pTexture = new sQ3BSPTexture;
        memcpy( pTexture, &m_Data[ Offset ], sizeof(sQ3BSPTexture) );
        m_pModel->m_Textures[ idx ] = pTexture;
        Offset += sizeof(sQ3BSPTexture);
    }
}